

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFFormValue.cpp
# Opt level: O0

Optional<llvm::DWARFFormValue::UnitOffset> * __thiscall
llvm::DWARFFormValue::getAsRelativeReference
          (Optional<llvm::DWARFFormValue::UnitOffset> *__return_storage_ptr__,DWARFFormValue *this)

{
  bool bVar1;
  uint uVar2;
  UnitOffset local_30;
  UnitOffset local_20;
  DWARFFormValue *local_10;
  DWARFFormValue *this_local;
  
  local_10 = this;
  bVar1 = isFormClass(this,FC_Reference);
  if (!bVar1) {
    Optional<llvm::DWARFFormValue::UnitOffset>::Optional(__return_storage_ptr__,None);
    return __return_storage_ptr__;
  }
  uVar2 = (uint)this->Form;
  if (uVar2 != 0x10) {
    if (uVar2 - 0x11 < 5) {
      if (this->U == (DWARFUnit *)0x0) {
        Optional<llvm::DWARFFormValue::UnitOffset>::Optional(__return_storage_ptr__,None);
        return __return_storage_ptr__;
      }
      local_20.Unit = this->U;
      local_20.Offset = *(uint64_t *)&(this->Value).field_0;
      Optional<llvm::DWARFFormValue::UnitOffset>::Optional(__return_storage_ptr__,&local_20);
      return __return_storage_ptr__;
    }
    if ((uVar2 != 0x20) && (uVar2 != 0x1f20)) {
      Optional<llvm::DWARFFormValue::UnitOffset>::Optional(__return_storage_ptr__,None);
      return __return_storage_ptr__;
    }
  }
  local_30.Unit = (DWARFUnit *)0x0;
  local_30.Offset = *(uint64_t *)&(this->Value).field_0;
  Optional<llvm::DWARFFormValue::UnitOffset>::Optional(__return_storage_ptr__,&local_30);
  return __return_storage_ptr__;
}

Assistant:

Optional<DWARFFormValue::UnitOffset> DWARFFormValue::getAsRelativeReference() const {
  if (!isFormClass(FC_Reference))
    return None;
  switch (Form) {
  case DW_FORM_ref1:
  case DW_FORM_ref2:
  case DW_FORM_ref4:
  case DW_FORM_ref8:
  case DW_FORM_ref_udata:
    if (!U)
      return None;
    return UnitOffset{const_cast<DWARFUnit*>(U), Value.uval};
  case DW_FORM_ref_addr:
  case DW_FORM_ref_sig8:
  case DW_FORM_GNU_ref_alt:
    return UnitOffset{nullptr, Value.uval};
  default:
    return None;
  }
}